

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_message.c
# Opt level: O3

TsStatus_t
ts_message_decode(TsMessageRef_t message,TsEncoder_t encoder,uint8_t *buffer,size_t buffer_size)

{
  TsStatus_t TVar1;
  cJSON *value;
  
  if (message == (TsMessageRef_t)0x0) {
    return TsStatusErrorPreconditionFailed;
  }
  TVar1 = TsStatusErrorNotImplemented;
  if (encoder == TsEncoderJson) {
    if (buffer == (uint8_t *)0x0) {
      return TsStatusError;
    }
    value = (cJSON *)cJSON_Parse(buffer);
    if (value->type == 0x40) {
      value = value->child;
    }
    TVar1 = ts_message_decode_json(message,value);
    cJSON_Delete(value);
  }
  return TVar1;
}

Assistant:

TsStatus_t ts_message_decode(TsMessageRef_t message, TsEncoder_t encoder, uint8_t *buffer, size_t buffer_size)
{
	/* check preconditions */
	if (message == NULL) {
		return TsStatusErrorPreconditionFailed;
	}

	/* perform encoding */
	switch (encoder) {

	case TsEncoderJson: {

		if (buffer == NULL) {
			return TsStatusErrorBadRequest;
		}

		cJSON *cjson = cJSON_Parse((const char *) buffer);
		if (cjson->type == cJSON_Object) {
			cjson = cjson->child;
		}
		TsStatus_t status = ts_message_decode_json(message, cjson);
		cJSON_Delete(cjson);

		return status;
	}

	case TsEncoderCbor:
		/* not implemented */
		/* fallthrough */

	case TsEncoderDebug:
	default:
		/* do nothing */
		break;
	}
	return TsStatusErrorNotImplemented;
}